

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcyclicityIndex.cpp
# Opt level: O3

void __thiscall
Indexing::AcyclicityIndex::CycleSearchIterator::CycleSearchIterator
          (CycleSearchIterator *this,Literal *queryLit,Clause *queryClause,AcyclicityIndex *aindex)

{
  CycleSearchTreeNode ***pppCVar1;
  uint uVar2;
  DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_00;
  RobSubstitution *this_01;
  Entry *pEVar3;
  Entry *pEVar4;
  CycleSearchTreeNode *pCVar5;
  CycleSearchTreeNode **ppCVar6;
  TermList sort;
  TermList local_60;
  pair<Kernel::Literal_*,_Kernel::Clause_*> local_58;
  uint64_t local_48;
  uint64_t uStack_40;
  
  this->_queryLit = queryLit;
  this->_index = (SIndex *)0x0;
  this->_tis = (TermIndexingStructure *)0x0;
  this->_nextResult = (CycleQueryResult *)0x0;
  (this->_stack)._capacity = 0;
  (this->_stack)._stack = (CycleSearchTreeNode **)0x0;
  (this->_stack)._cursor = (CycleSearchTreeNode **)0x0;
  (this->_stack)._end = (CycleSearchTreeNode **)0x0;
  this_01 = (RobSubstitution *)::operator_new(200,8);
  Kernel::RobSubstitution::RobSubstitution(this_01);
  this->_subst = this_01;
  (this->_substChanges)._capacity = 0;
  (this->_substChanges)._stack = (BacktrackData *)0x0;
  (this->_substChanges)._cursor = (BacktrackData *)0x0;
  (this->_substChanges)._end = (BacktrackData *)0x0;
  this->_nextAvailableIndex = 0;
  this->_currentDepth = 0;
  if ((queryLit->super_Term)._functor == 0) {
    local_60 = Kernel::SortHelper::getEqualityArgumentSort(queryLit);
    pEVar3 = Lib::
             DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&aindex->_sIndexes,&local_60);
    if (pEVar3 != (Entry *)0x0) {
      local_58.first = (Literal *)local_60._content;
      pEVar3 = Lib::
               DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry(&aindex->_sIndexes,(TermList *)&local_58);
      this_00 = pEVar3->_val;
      this->_index = this_00;
      this->_tis = aindex->_tis;
      local_58.first = queryLit;
      local_58.second = queryClause;
      pEVar4 = Lib::
               DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry(this_00,&local_58);
      if (pEVar4 != (Entry *)0x0) {
        local_58.first = queryLit;
        local_58.second = queryClause;
        pEVar4 = Lib::
                 DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::findEntry(this->_index,&local_58);
        local_48 = (pEVar4->_val->t).super_TermList._content;
        uStack_40 = (pEVar4->_val->t)._sort._content;
        uVar2 = this->_nextAvailableIndex;
        this->_nextAvailableIndex = uVar2 + 1;
        pCVar5 = (CycleSearchTreeNode *)
                 Lib::FixedSizeAllocator<64UL>::alloc
                           ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
        ;
        (pCVar5->term).super_TermList._content = local_48;
        (pCVar5->term)._sort._content = uStack_40;
        pCVar5->lit = queryLit;
        pCVar5->clause = queryClause;
        pCVar5->parent = (CycleSearchTreeNode *)0x0;
        pCVar5->depth = 0;
        pCVar5->substIndex = uVar2;
        pCVar5->isUnificationNode = true;
        ppCVar6 = (this->_stack)._cursor;
        if (ppCVar6 == (this->_stack)._end) {
          Lib::Stack<Indexing::AcyclicityIndex::CycleSearchTreeNode_*>::expand(&this->_stack);
          ppCVar6 = (this->_stack)._cursor;
        }
        *ppCVar6 = pCVar5;
        pppCVar1 = &(this->_stack)._cursor;
        *pppCVar1 = *pppCVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

CycleSearchIterator(Literal *queryLit,
                        Clause *queryClause,
                        AcyclicityIndex& aindex)
      :
      _queryLit(queryLit),
      _index(nullptr),
      _tis(nullptr),
      _nextResult(nullptr),
      _stack(0),
      _subst(new RobSubstitution()),
      _substChanges(0),
      _nextAvailableIndex(0),
      _currentDepth(0)
    {
      if (queryLit->isEquality()) {
        TermList sort = SortHelper::getEqualityArgumentSort(queryLit);

        if (aindex._sIndexes.find(sort)) {
          _index = aindex._sIndexes.get(sort);
          _tis = aindex._tis;
          if (_index->find(make_pair(queryLit, queryClause))) {
            IndexEntry *entry = _index->get(make_pair(queryLit, queryClause));
            _stack.push(CycleSearchTreeNode::unificationNode(entry->t,
                                                             queryLit,
                                                             queryClause,
                                                             nullptr,
                                                             _nextAvailableIndex++));
          }
        }
      }
      ASS_EQ(_currentDepth, _substChanges.size());
    }